

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O2

void __thiscall OpenMD::LJ::calcForce(LJ *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  LJ *this_00;
  RealType RVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  RealType myDeriv;
  RealType myPot;
  RealType local_80;
  RealType local_78;
  double local_70;
  double local_68;
  double local_60;
  RealType local_58;
  RealType local_50;
  Vector<double,_3U> local_48;
  Vector<double,_3U> local_30;
  
  this_00 = this;
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar4 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar4[idat->atid1]].
                    super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar6 = (long)piVar4[idat->atid2] * 0x20;
  local_60 = *(double *)(lVar5 + 8 + lVar6);
  dVar1 = *(double *)(lVar5 + 0x10 + lVar6);
  local_50 = 0.0;
  local_78 = 0.0;
  local_58 = 0.0;
  local_80 = 0.0;
  local_68 = idat->rij;
  getLJfunc(this_00,dVar1 * local_68,&local_50,&local_58);
  if (idat->shiftedPot == true) {
    getLJfunc(this_00,idat->rcut * dVar1,&local_78,&local_80);
    RVar7 = local_78;
    dVar10 = 0.0;
  }
  else {
    RVar7 = 0.0;
    dVar10 = 0.0;
    if (idat->shiftedForce == true) {
      local_70 = idat->rcut;
      getLJfunc(this_00,dVar1 * local_70,&local_78,&local_80);
      RVar7 = (local_68 - local_70) * local_80 * dVar1 + local_78;
      dVar10 = local_80;
    }
  }
  dVar2 = idat->sw;
  dVar3 = idat->vdwMult;
  dVar9 = (local_50 - RVar7) * local_60 * dVar3;
  dVar8 = dVar2 * dVar9;
  idat->vpair = dVar9 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar8;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar8 + (idat->selePot).data_[1];
  }
  operator*(&local_48,&(idat->d).super_Vector<double,_3U>,
            dVar1 * (local_58 - dVar10) * local_60 * dVar3 * dVar2);
  operator/(&local_30,&local_48,idat->rij);
  Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_30);
  return;
}

Assistant:

void LJ::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    LJInteractionData& mixer =
        MixingMap[LJtids[idat.atid1]][LJtids[idat.atid2]];

    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getLJfunc(ros, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getLJfunc(rcos, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getLJfunc(rcos, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr =
        idat.sw * idat.vdwMult * epsilon * (myDeriv - myDerivC) * sigmai;
    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }